

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionScreenCast::PlayAttackSound(DIntermissionScreenCast *this)

{
  FState *pFVar1;
  FState *pFVar2;
  uint uVar3;
  uint uVar4;
  FICastSound *pFVar5;
  FSoundID local_18;
  uint local_14;
  DIntermissionScreenCast *pDStack_10;
  uint i;
  DIntermissionScreenCast *this_local;
  
  if ((this->caststate != (FState *)0x0) && ((this->castattacking & 1U) != 0)) {
    pDStack_10 = this;
    for (local_14 = 0; uVar3 = local_14,
        uVar4 = TArray<FICastSound,_FICastSound>::Size(&this->mCastSounds), uVar3 < uVar4;
        local_14 = local_14 + 1) {
      pFVar5 = TArray<FICastSound,_FICastSound>::operator[](&this->mCastSounds,(ulong)local_14);
      if (((pFVar5->mSequence != '\0') == (this->basestate != this->mDefaults->MissileState)) &&
         (pFVar1 = this->caststate, pFVar2 = this->basestate,
         pFVar5 = TArray<FICastSound,_FICastSound>::operator[](&this->mCastSounds,(ulong)local_14),
         pFVar1 == pFVar2 + (int)(uint)pFVar5->mIndex)) {
        S_StopAllChannels();
        pFVar5 = TArray<FICastSound,_FICastSound>::operator[](&this->mCastSounds,(ulong)local_14);
        FSoundID::FSoundID(&local_18,&pFVar5->mSound);
        S_Sound(0x21,&local_18,1.0,0.0);
        return;
      }
    }
  }
  return;
}

Assistant:

void DIntermissionScreenCast::PlayAttackSound()
{
	// sound hacks....
	if (caststate != NULL && castattacking)
	{
		for (unsigned i = 0; i < mCastSounds.Size(); i++)
		{
			if ((!!mCastSounds[i].mSequence) == (basestate != mDefaults->MissileState) &&
				(caststate == basestate + mCastSounds[i].mIndex))
			{
				S_StopAllChannels ();
				S_Sound (CHAN_WEAPON | CHAN_UI, mCastSounds[i].mSound, 1, ATTN_NONE);
				return;
			}
		}
	}

}